

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_dir_and_check_ours.c
# Opt level: O1

char * make_dir_and_check_ours(char *dirname)

{
  int iVar1;
  __uid_t _Var2;
  int *piVar3;
  char *pcVar4;
  char *fmt;
  stat st;
  stat local_a0;
  
  iVar1 = mkdir(dirname,0x1c0);
  if (iVar1 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      pcVar4 = strerror(*piVar3);
      fmt = "%s: mkdir: %s";
      goto LAB_0016fab8;
    }
  }
  iVar1 = stat(dirname,&local_a0);
  if (-1 < iVar1) {
    _Var2 = getuid();
    if (local_a0.st_uid == _Var2) {
      if ((local_a0.st_mode & 0x3f) == 0) {
        return (char *)0x0;
      }
      local_a0.st_uid = local_a0.st_mode & 0x1ff;
      pcVar4 = "%s: directory has overgenerous permissions %03o (expected 700)";
    }
    else {
      pcVar4 = "%s: directory owned by uid %d, not by us";
    }
    pcVar4 = dupprintf(pcVar4,dirname,(ulong)local_a0.st_uid);
    return pcVar4;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fmt = "%s: stat: %s";
LAB_0016fab8:
  pcVar4 = dupprintf(fmt,dirname,pcVar4);
  return pcVar4;
}

Assistant:

char *make_dir_and_check_ours(const char *dirname)
{
    struct stat st;

    /*
     * Create the directory. We might have created it before, so
     * EEXIST is an OK error; but anything else is doom.
     */
    if (mkdir(dirname, 0700) < 0 && errno != EEXIST)
        return dupprintf("%s: mkdir: %s", dirname, strerror(errno));

    /*
     * Stat the directory and check its ownership and permissions.
     */
    if (stat(dirname, &st) < 0)
        return dupprintf("%s: stat: %s", dirname, strerror(errno));
    if (st.st_uid != getuid())
        return dupprintf("%s: directory owned by uid %d, not by us",
                         dirname, st.st_uid);
    if ((st.st_mode & 077) != 0)
        return dupprintf("%s: directory has overgenerous permissions %03o"
                         " (expected 700)", dirname, st.st_mode & 0777);

    return NULL;
}